

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68000_bchg_s(m68k_info *info)

{
  uint imm;
  
  imm = read_imm_8(info);
  build_imm_ea(info,0x1d,'\x01',imm);
  return;
}

Assistant:

static void d68000_bchg_s(m68k_info *info)
{
	build_imm_ea(info, M68K_INS_BCHG, 1, read_imm_8(info));
}